

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Writer.cpp
# Opt level: O1

void __thiscall OSTEI_VRR_Writer::WriteVRR_Inline_(OSTEI_VRR_Writer *this,ostream *os,QAM *am)

{
  pointer pcVar1;
  OSTEI_VRR_Algorithm_Base *pOVar2;
  uint __val;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  OSTEI_VRR_Writer *this_00;
  uint uVar7;
  uint __len;
  string __str;
  string local_118;
  undefined1 local_f8 [16];
  _Alloc_hider local_e8;
  char local_d8 [16];
  undefined1 local_c8 [16];
  _Alloc_hider local_b8;
  char local_a8 [16];
  undefined1 local_98 [16];
  _Alloc_hider local_88;
  char local_78 [24];
  _Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
  local_60;
  
  local_c8._0_4_ = (am->qam)._M_elems[0];
  local_c8._4_4_ = (am->qam)._M_elems[1];
  local_c8._8_4_ = (am->qam)._M_elems[2];
  local_c8._12_4_ = (am->qam)._M_elems[3];
  local_b8._M_p = local_a8;
  pcVar1 = (am->tag)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar1,pcVar1 + (am->tag)._M_string_length);
  pOVar2 = this->vrr_algo_;
  local_98._0_4_ = (am->qam)._M_elems[0];
  local_98._4_4_ = (am->qam)._M_elems[1];
  local_98._8_4_ = (am->qam)._M_elems[2];
  local_98._12_4_ = (am->qam)._M_elems[3];
  pcVar1 = (am->tag)._M_dataplus._M_p;
  local_88._M_p = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + (am->tag)._M_string_length);
  OSTEI_VRR_Algorithm_Base::GetSteps((VRR_StepSet *)&local_60,pOVar2,(QAM *)local_98);
  pOVar2 = this->vrr_algo_;
  local_f8._0_4_ = (am->qam)._M_elems[0];
  local_f8._4_4_ = (am->qam)._M_elems[1];
  local_f8._8_4_ = (am->qam)._M_elems[2];
  local_f8._12_4_ = (am->qam)._M_elems[3];
  local_e8._M_p = local_d8;
  pcVar1 = (am->tag)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar1,pcVar1 + (am->tag)._M_string_length);
  iVar4 = OSTEI_VRR_Algorithm_Base::GetMReq(pOVar2,(QAM *)local_f8);
  uVar7 = iVar4 + 1;
  __val = -uVar7;
  if (0 < (int)uVar7) {
    __val = uVar7;
  }
  __len = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_0011b116;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_0011b116;
      }
      if (uVar5 < 10000) goto LAB_0011b116;
      uVar6 = uVar6 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_0011b116:
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_118,(char)__len - (char)((int)uVar7 >> 0x1f));
  this_00 = (OSTEI_VRR_Writer *)(local_118._M_dataplus._M_p + (uVar7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)this_00,__len,__val);
  WriteVRRSteps_(this_00,os,(QAM *)local_c8,(VRR_StepSet *)&local_60,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (local_e8._M_p != local_d8) {
    operator_delete(local_e8._M_p);
  }
  std::
  _Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
  ::~_Rb_tree(&local_60);
  if (local_88._M_p != local_78) {
    operator_delete(local_88._M_p);
  }
  if (local_b8._M_p != local_a8) {
    operator_delete(local_b8._M_p);
  }
  return;
}

Assistant:

void OSTEI_VRR_Writer::WriteVRR_Inline_(std::ostream & os, QAM am) const
{
    WriteVRRSteps_(os, am, vrr_algo_.GetSteps(am), 
                   std::to_string(vrr_algo_.GetMReq(am)+1));
}